

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteIndent(CWriter *this)

{
  ulong local_18;
  size_t to_write;
  CWriter *this_local;
  
  for (local_18 = (ulong)this->indent_; WriteIndent::s_indent_len <= local_18;
      local_18 = local_18 - WriteIndent::s_indent_len) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,WriteIndent::s_indent_len,(char *)0x0,No);
  }
  if (local_18 != 0) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,local_18,(char *)0x0,No);
  }
  return;
}

Assistant:

void CWriter::WriteIndent() {
  static char s_indent[] =
      "                                                                       "
      "                                                                       ";
  static size_t s_indent_len = sizeof(s_indent) - 1;
  size_t to_write = indent_;
  while (to_write >= s_indent_len) {
    stream_->WriteData(s_indent, s_indent_len);
    to_write -= s_indent_len;
  }
  if (to_write > 0) {
    stream_->WriteData(s_indent, to_write);
  }
}